

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O0

char * make_u_type(int i)

{
  char *pcStack_10;
  int i_local;
  
  if (i == 1) {
    pcStack_10 = "uint8";
  }
  else if (i == 2) {
    pcStack_10 = "uint16";
  }
  else if (i == 4) {
    pcStack_10 = "uint32";
  }
  else {
    d_fail("bad case");
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

static char *make_u_type(int i) {
  switch (i) {
    case 1:
      return "uint8";
    case 2:
      return "uint16";
    case 4:
      return "uint32";
    default:
      d_fail("bad case");
      return "";
  }
}